

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

Block * ylt::detail::moodycamel::
        ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
        ::
        create_array<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::Block>
                  (size_t count)

{
  Block *in_RDI;
  size_t i;
  Block *p;
  Block *local_20;
  Block *local_8;
  
  local_8 = (Block *)aligned_malloc<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::Block>
                               (0x4472c7);
  if (local_8 == (Block *)0x0) {
    local_8 = (Block *)0x0;
  }
  else {
    for (local_20 = (Block *)0x0; local_20 != in_RDI; local_20 = (Block *)(local_20->elements + 1))
    {
      ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
      ::Block::Block(in_RDI);
    }
  }
  return local_8;
}

Assistant:

static inline U* create_array(size_t count) {
    assert(count > 0);
    U* p = static_cast<U*>(aligned_malloc<U>(sizeof(U) * count));
    if (p == nullptr)
      return nullptr;

    for (size_t i = 0; i != count; ++i) new (p + i) U();
    return p;
  }